

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void return_example(vw *all,example *ec)

{
  bool holdout_set_off;
  int *piVar1;
  shared_data *this;
  size_t current_pass;
  int *piVar2;
  string local_50;
  
  shared_data::update(all->sd,ec->test_only,true,ec->loss,ec->weight,ec->num_features);
  piVar2 = (all->final_prediction_sink)._begin;
  piVar1 = (all->final_prediction_sink)._end;
  if (piVar2 != piVar1) {
    do {
      MWT::print_scalars(*piVar2,&(ec->pred).scalars,&ec->tag);
      piVar2 = piVar2 + 1;
    } while (piVar2 != piVar1);
  }
  this = all->sd;
  if (((double)this->dump_interval <=
       this->weighted_labeled_examples + this->weighted_unlabeled_examples) && (all->quiet == false)
     ) {
    holdout_set_off = all->holdout_set_off;
    current_pass = all->current_pass;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"none","");
    shared_data::print_update
              (this,holdout_set_off,current_pass,&local_50,0,ec->num_features,all->progress_add,
               all->progress_arg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  VW::finish_example(all,ec);
  return;
}

Assistant:

void return_example(vw &all, example &ec)
{
  all.sd->update(ec.test_only, true, ec.loss, ec.weight, ec.num_features);
  for (int f : all.final_prediction_sink) MWT::print_scalars(f, ec.pred.scalars, ec.tag);

  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet)
    all.sd->print_update(
        all.holdout_set_off, all.current_pass, "none", 0, ec.num_features, all.progress_add, all.progress_arg);
  VW::finish_example(all, ec);
}